

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall
cmTarget::PushTLLCommandTrace(cmTarget *this,TLLSignature signature,cmListFileContext *lfc)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  TLLSignature local_1c;
  
  ppVar1 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c = signature;
  if ((this->TLLCommands).
      super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
      ._M_impl.super__Vector_impl_data._M_start == ppVar1) {
    bVar3 = true;
  }
  else {
    bVar3 = ppVar1[-1].first == signature;
    bVar2 = operator!=(&ppVar1[-1].second,lfc);
    if (!bVar2) {
      return bVar3;
    }
  }
  std::
  vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
  ::emplace_back<cmTarget::TLLSignature&,cmListFileContext_const&>
            ((vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
              *)&this->TLLCommands,&local_1c,lfc);
  return bVar3;
}

Assistant:

bool cmTarget::PushTLLCommandTrace(TLLSignature signature,
                                   cmListFileContext const& lfc)
{
  bool ret = true;
  if (!this->TLLCommands.empty()) {
    if (this->TLLCommands.back().first != signature) {
      ret = false;
    }
  }
  if (this->TLLCommands.empty() || this->TLLCommands.back().second != lfc) {
    this->TLLCommands.emplace_back(signature, lfc);
  }
  return ret;
}